

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O2

StringBuilder * __thiscall nv::StringBuilder::number(StringBuilder *this,int i,int base)

{
  int iVar1;
  char *pcVar2;
  float fVar3;
  float fVar4;
  
  if (base < 2) {
    pcVar2 = "base >= 2";
    iVar1 = 0x162;
  }
  else {
    if ((uint)base < 0x25) goto LAB_001b2f58;
    pcVar2 = "base <= 36";
    iVar1 = 0x163;
  }
  iVar1 = nvAbort(pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                  ,iVar1,"StringBuilder &nv::StringBuilder::number(int, int)");
  if (iVar1 == 1) {
    raise(5);
  }
LAB_001b2f58:
  fVar3 = logf((float)i);
  fVar4 = logf((float)base);
  reserve(this,(uint)(long)(fVar3 / fVar4 + 2.0));
  pcVar2 = this->m_str;
  if (i < 0) {
    *pcVar2 = '-';
    i = -i;
    pcVar2 = this->m_str + 1;
  }
  pcVar2 = anon_unknown.dwarf_4ed21e::i2a(i,pcVar2,base);
  *pcVar2 = '\0';
  return this;
}

Assistant:

StringBuilder & StringBuilder::number( int i, int base )
{
	nvCheck( base >= 2 );
	nvCheck( base <= 36 );

	// @@ This needs to be done correctly.
	// length = floor(log(i, base));
	uint len = uint(log(float(i)) / log(float(base)) + 2);	// one more if negative
	reserve(len);

	if( i < 0 ) {
		*m_str = '-';
		*i2a(uint(-i), m_str+1, base) = 0;
	}
	else {
		*i2a(i, m_str, base) = 0;
	}

	return *this;
}